

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  uint *in_RCX;
  uint *in_RDX;
  short *in_RSI;
  void *in_R8;
  int in_R9D;
  uint in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if (in_R9D == 0) {
    local_8 = FSE_readNCount_body_default
                        (in_RSI,in_RDX,in_RCX,in_R8,(ulong)in_stack_ffffffffffffffc8);
  }
  else {
    local_8 = FSE_readNCount_body_bmi2
                        (in_RSI,in_RDX,in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  }
  return local_8;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}